

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O0

void __thiscall adios2::aggregator::MPIShmChain::Close(MPIShmChain *this)

{
  MPIAggregator *in_RDI;
  string *in_stack_fffffffffffffef8;
  Comm *in_stack_ffffffffffffff00;
  int *this_00;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  if ((in_RDI->m_IsActive & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"free per-node comm in ~MPIShmChain()",&local_29);
    helper::Comm::Free(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"free chain of nodes in ~MPIShmChain()",&local_61);
    helper::Comm::Free(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"free comm of all aggregators in ~MPIShmChain()",&local_89);
    helper::Comm::Free(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    this_00 = &in_RDI[1].m_Rank;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"free chains of aggregators in ~MPIShmChain()",&local_b1);
    helper::Comm::Free((Comm *)this_00,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  MPIAggregator::Close(in_RDI);
  return;
}

Assistant:

void MPIShmChain::Close()
{
    if (m_IsActive)
    {
        m_NodeComm.Free("free per-node comm in ~MPIShmChain()");
        m_OnePerNodeComm.Free("free chain of nodes in ~MPIShmChain()");
        m_AllAggregatorsComm.Free("free comm of all aggregators in ~MPIShmChain()");
        m_AggregatorChainComm.Free("free chains of aggregators in ~MPIShmChain()");
    }
    MPIAggregator::Close();
}